

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitSIMDShift
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          SIMDShift *curr)

{
  Literal *__return_storage_ptr___00;
  Literal local_1f8;
  Literal local_1e0;
  Literal local_1c8;
  Literal local_1b0;
  Literal local_198;
  Literal local_180;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  Literal local_f0;
  Literal shift;
  pointer local_a0;
  char *pcStack_98;
  undefined1 local_90 [8];
  Flow flow;
  Literal vec;
  
  visit((Flow *)local_90,this,curr->vec);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_90 != 1) {
LAB_00d2e15b:
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,(Literal *)&flow);
    visit((Flow *)&stack0xffffffffffffff28,this,curr->shift);
    SmallVector<wasm::Literal,_1UL>::operator=
              ((SmallVector<wasm::Literal,_1UL> *)local_90,
               (SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff28);
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_a0;
    flow.breakTo.super_IString.str._M_len = (size_t)pcStack_98;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&stack0xffffffffffffff48);
    Literal::~Literal(&shift);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3)
          * -0x5555555555555555 + (long)local_90 != 1) goto LAB_00d2e15b;
      Literal::Literal((Literal *)&stack0xffffffffffffff28,(Literal *)&flow);
      switch(curr->op) {
      case ShlVecI8x16:
        __return_storage_ptr___00 = &local_1f8;
        Literal::shlI8x16(__return_storage_ptr___00,
                          (Literal *)&flow.breakTo.super_IString.str._M_str,
                          (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShrSVecI8x16:
        __return_storage_ptr___00 = &local_1e0;
        Literal::shrSI8x16(__return_storage_ptr___00,
                           (Literal *)&flow.breakTo.super_IString.str._M_str,
                           (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShrUVecI8x16:
        __return_storage_ptr___00 = &local_1c8;
        Literal::shrUI8x16(__return_storage_ptr___00,
                           (Literal *)&flow.breakTo.super_IString.str._M_str,
                           (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShlVecI16x8:
        __return_storage_ptr___00 = &local_1b0;
        Literal::shlI16x8(__return_storage_ptr___00,
                          (Literal *)&flow.breakTo.super_IString.str._M_str,
                          (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShrSVecI16x8:
        __return_storage_ptr___00 = &local_198;
        Literal::shrSI16x8(__return_storage_ptr___00,
                           (Literal *)&flow.breakTo.super_IString.str._M_str,
                           (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShrUVecI16x8:
        __return_storage_ptr___00 = &local_180;
        Literal::shrUI16x8(__return_storage_ptr___00,
                           (Literal *)&flow.breakTo.super_IString.str._M_str,
                           (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShlVecI32x4:
        __return_storage_ptr___00 = &local_168;
        Literal::shlI32x4(__return_storage_ptr___00,
                          (Literal *)&flow.breakTo.super_IString.str._M_str,
                          (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShrSVecI32x4:
        __return_storage_ptr___00 = &local_150;
        Literal::shrSI32x4(__return_storage_ptr___00,
                           (Literal *)&flow.breakTo.super_IString.str._M_str,
                           (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShrUVecI32x4:
        __return_storage_ptr___00 = &local_138;
        Literal::shrUI32x4(__return_storage_ptr___00,
                           (Literal *)&flow.breakTo.super_IString.str._M_str,
                           (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShlVecI64x2:
        __return_storage_ptr___00 = &local_120;
        Literal::shlI64x2(__return_storage_ptr___00,
                          (Literal *)&flow.breakTo.super_IString.str._M_str,
                          (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShrSVecI64x2:
        __return_storage_ptr___00 = &local_108;
        Literal::shrSI64x2(__return_storage_ptr___00,
                           (Literal *)&flow.breakTo.super_IString.str._M_str,
                           (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ShrUVecI64x2:
        __return_storage_ptr___00 = &local_f0;
        Literal::shrUI64x2(__return_storage_ptr___00,
                           (Literal *)&flow.breakTo.super_IString.str._M_str,
                           (Literal *)&stack0xffffffffffffff28);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      default:
        handle_unreachable("invalid op",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0x54b);
      }
      Literal::~Literal(__return_storage_ptr___00);
      Literal::~Literal((Literal *)&stack0xffffffffffffff28);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)local_90;
      Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                       _M_elems,(Literal *)&flow);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)flow.breakTo.super_IString.str._M_len;
    }
    Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_90;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDShift(SIMDShift* curr) {
    NOTE_ENTER("SIMDShift");
    Flow flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    flow = self()->visit(curr->shift);
    if (flow.breaking()) {
      return flow;
    }
    Literal shift = flow.getSingleValue();
    switch (curr->op) {
      case ShlVecI8x16:
        return vec.shlI8x16(shift);
      case ShrSVecI8x16:
        return vec.shrSI8x16(shift);
      case ShrUVecI8x16:
        return vec.shrUI8x16(shift);
      case ShlVecI16x8:
        return vec.shlI16x8(shift);
      case ShrSVecI16x8:
        return vec.shrSI16x8(shift);
      case ShrUVecI16x8:
        return vec.shrUI16x8(shift);
      case ShlVecI32x4:
        return vec.shlI32x4(shift);
      case ShrSVecI32x4:
        return vec.shrSI32x4(shift);
      case ShrUVecI32x4:
        return vec.shrUI32x4(shift);
      case ShlVecI64x2:
        return vec.shlI64x2(shift);
      case ShrSVecI64x2:
        return vec.shrSI64x2(shift);
      case ShrUVecI64x2:
        return vec.shrUI64x2(shift);
    }
    WASM_UNREACHABLE("invalid op");
  }